

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpt.cpp
# Opt level: O1

void __thiscall
indigox::algorithm::TDVertScore::JoinPropagate
          (TDVertScore *this,shared_ptr<indigox::algorithm::TDVertScore> *a,
          shared_ptr<indigox::algorithm::TDVertScore> *b)

{
  VertMask *__x;
  _Base_ptr *pp_Var1;
  _Rb_tree_node_base *__args;
  _Rb_tree_color _Var2;
  element_type *peVar3;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  *this_00;
  iterator iVar4;
  mapped_type *pmVar5;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
  *this_01;
  mapped_type *pmVar6;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_02;
  size_type sVar7;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
  *this_03;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_const_iterator<unsigned_int> _Var10;
  iterator __position;
  _Rb_tree_node_base *p_Var11;
  TDVertScore *pTVar12;
  _Rb_tree_header *p_Var13;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar14;
  uint32_t e;
  BagScores tmpBags;
  Score s;
  VertMask notFMask;
  _Rb_tree_color local_f4;
  TDVertScore *local_f0;
  _Rb_tree_node_base *local_e8;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  local_e0;
  _Base_ptr local_b0;
  uint local_a4;
  _Rb_tree_node_base *local_a0;
  TDVertScore *local_98;
  shared_ptr<indigox::algorithm::TDVertScore> *local_90;
  shared_ptr<indigox::algorithm::TDVertScore> *local_88;
  _Base_ptr local_80;
  _Rb_tree_node_base *local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Rb_tree_node_base *local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_90 = a;
  local_88 = b;
  boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0,
                   &((a->
                     super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->fMask,
                   &((b->
                     super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->fMask);
  __x = &this->fMask;
  if ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e0 != __x) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&__x->m_bits,&local_e0);
    (this->fMask).m_num_bits = (size_type)local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_e0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  }
  if ((pointer)local_e0._M_impl._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._M_impl._0_8_,
                    (long)local_e0._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_e0._M_impl._0_8_);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_50.m_bits,&__x->m_bits);
  local_50.m_num_bits = (this->fMask).m_num_bits;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::flip(&local_50);
  local_f4 = this->min_e;
  local_f0 = this;
  if (local_f4 <= this->max_e) {
    p_Var13 = &local_e0._M_impl.super__Rb_tree_header;
    do {
      local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var13->_M_header;
      local_e0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var13->_M_header;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig...:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
      ::
      _M_emplace_unique<unsigned_int&,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>&>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>,std::_Select1st<std::pair<unsigned_int_const,std::map<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsig___:pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>>>>
                  *)&this->score,&local_f4,
                 (map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                  *)&local_e0);
      std::
      _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
      ::~_Rb_tree(&local_e0);
      local_f4 = local_f4 + _S_black;
    } while (local_f4 <= local_f0->max_e);
  }
  peVar3 = (local_90->
           super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b0 = *(_Base_ptr *)
              ((long)&(peVar3->score)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  local_70 = &(peVar3->score)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_b0 != local_70) {
    local_e8 = (_Rb_tree_node_base *)&local_f0->score;
    do {
      peVar3 = (local_88->
               super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var8 = *(_Base_ptr *)
                ((long)&(peVar3->score)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      local_68 = &(peVar3->score)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var8 != local_68) {
        local_78 = (_Rb_tree_node_base *)&local_b0[1]._M_left;
        do {
          local_f4 = p_Var8[1]._M_color + local_b0[1]._M_color;
          local_80 = p_Var8;
          if (((local_f0->min_e <= local_f4) && (local_f4 <= local_f0->max_e)) &&
             (local_a0 = *(_Rb_tree_node_base **)(local_b0 + 2), local_a0 != local_78)) {
            local_98 = (TDVertScore *)&p_Var8[1]._M_parent;
            local_60 = (_Base_ptr)&p_Var8[1]._M_left;
            do {
              this_00 = &std::
                         map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                         ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                               *)local_e8,&local_f4)->_M_t;
              p_Var11 = local_a0 + 1;
              iVar4 = std::
                      _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      ::find(this_00,(key_type *)p_Var11);
              pmVar5 = std::
                       map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                       ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                             *)local_e8,&local_f4);
              if ((_Rb_tree_header *)iVar4._M_node == &(pmVar5->_M_t)._M_impl.super__Rb_tree_header)
              {
                local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_e0._M_impl.super__Rb_tree_header._M_header;
                local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
                this_01 = (_Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                           *)std::
                             map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                             ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                                   *)local_e8,&local_f4);
                std::
                _Rb_tree<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>,std::_Select1st<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>,std::less<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>>>>
                ::
                _M_emplace_unique<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,std::multimap<unsigned_int,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>&>
                          (this_01,(dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   p_Var11,
                           (multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)&local_e0);
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             *)&local_e0);
              }
              iVar4 = std::
                      _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                      ::find((_Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                              *)local_98,(key_type *)p_Var11);
              if (iVar4._M_node != local_60) {
                p_Var9 = local_a0[2]._M_right;
                local_58 = (_Rb_tree_node_base *)&local_a0[2]._M_parent;
                if (p_Var9 != local_58) {
                  do {
                    pmVar6 = std::
                             map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                             ::at((map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                   *)local_98,(key_type *)p_Var11);
                    p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var13 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
                    if ((_Rb_tree_header *)p_Var8 != p_Var13) {
                      do {
                        local_a4 = p_Var8[1]._M_color + p_Var9[1]._M_color;
                        if (local_a4 <=
                            (local_f0->parent->super_ElectronOptimisationAlgorithm).upperLimit_) {
                          boost::operator|((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                            *)&local_e0,
                                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                            *)&p_Var9[1]._M_parent,
                                           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                            *)&p_Var8[1]._M_parent);
                          if (Options::AssignElectrons::MAXIMUM_RESULT_COUNT == 0) {
LAB_00120d25:
                            pmVar5 = std::
                                     map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                                     ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                                           *)local_e8,&local_f4);
                            this_03 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                                       *)std::
                                         map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                         ::at(pmVar5,(key_type *)p_Var11);
                            std::
                            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                            ::
                            _M_emplace_equal<unsigned_int&,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&>
                                      (this_03,&local_a4,
                                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                        *)&local_e0);
                          }
                          else {
                            pmVar5 = std::
                                     map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                                     ::at((map<unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>_>_>_>
                                           *)local_e8,&local_f4);
                            this_02 = &std::
                                       map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::multimap<unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                                       ::at(pmVar5,(key_type *)p_Var11)->_M_t;
                            sVar7 = std::
                                    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    ::count(this_02,&local_a4);
                            if (sVar7 < Options::AssignElectrons::MAXIMUM_RESULT_COUNT)
                            goto LAB_00120d25;
                          }
                          if ((pointer)local_e0._M_impl._0_8_ != (pointer)0x0) {
                            operator_delete((void *)local_e0._M_impl._0_8_,
                                            (long)local_e0._M_impl.super__Rb_tree_header._M_header.
                                                  _M_parent - local_e0._M_impl._0_8_);
                          }
                        }
                        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
                      } while ((_Rb_tree_header *)p_Var8 != p_Var13);
                    }
                    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
                  } while (p_Var9 != local_58);
                }
              }
              local_a0 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_a0);
            } while (local_a0 != local_78);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_80);
        } while (p_Var8 != local_68);
      }
      local_b0 = (_Base_ptr)std::_Rb_tree_increment(local_b0);
    } while (local_b0 != local_70);
  }
  if (Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH != 0) {
    pTVar12 = (TDVertScore *)(local_f0->score)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_f0 = (TDVertScore *)&(local_f0->score)._M_t._M_impl.super__Rb_tree_header;
    if (pTVar12 != local_f0) {
      do {
        p_Var11 = *(_Rb_tree_node_base **)&pTVar12->min_e;
        local_e8 = (_Rb_tree_node_base *)
                   &(pTVar12->score)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        local_98 = pTVar12;
        if (p_Var11 != local_e8) {
          do {
            local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_e0._M_impl.super__Rb_tree_header._M_header;
            local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
            pp_Var1 = &p_Var11[2]._M_parent;
            local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
            for (p_Var9 = p_Var11[2]._M_right; p_Var9 != (_Rb_tree_node_base *)pp_Var1;
                p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
              __args = p_Var9 + 1;
              if (local_e0._M_impl.super__Rb_tree_header._M_node_count <
                  Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH) {
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_emplace_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_e0,&__args->_M_color);
              }
              else {
                _Var10 = std::
                         __max_element<std::_Rb_tree_const_iterator<unsigned_int>,__gnu_cxx::__ops::_Iter_less_iter>
                                   (local_e0._M_impl.super__Rb_tree_header._M_header._M_left,
                                    &local_e0._M_impl.super__Rb_tree_header);
                local_f4 = _Var10._M_node[1]._M_color;
                if (__args->_M_color < local_f4) {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_emplace_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_e0,&__args->_M_color);
                }
                if (Options::AssignElectrons::FPT::MINIMUM_PROPAGATION_DEPTH <
                    local_e0._M_impl.super__Rb_tree_header._M_node_count) {
                  pVar14 = std::
                           _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::equal_range((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                          *)&local_e0,&local_f4);
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::_M_erase_aux((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&local_e0,(_Base_ptr)pVar14.first._M_node,
                                 (_Base_ptr)pVar14.second._M_node);
                }
              }
            }
            _Var10 = std::
                     __max_element<std::_Rb_tree_const_iterator<unsigned_int>,__gnu_cxx::__ops::_Iter_less_iter>
                               (local_e0._M_impl.super__Rb_tree_header._M_header._M_left,
                                &local_e0._M_impl.super__Rb_tree_header);
            __position._M_node = p_Var11[2]._M_right;
            if (__position._M_node != (_Base_ptr)pp_Var1) {
              _Var2 = _Var10._M_node[1]._M_color;
              do {
                if (_Var2 < __position._M_node[1]._M_color) {
                  __position = std::
                               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                               ::erase_abi_cxx11_((
                                                  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>,std::_Select1st<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>>>>
                                                  *)(p_Var11 + 2),__position);
                }
                else {
                  __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                }
              } while (__position._M_node != (_Base_ptr)pp_Var1);
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&local_e0);
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != local_e8);
        }
        pTVar12 = (TDVertScore *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_98);
      } while (pTVar12 != local_f0);
    }
  }
  std::_Rb_tree<$4b2183d$>::clear
            (&(((local_90->
                super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->score)._M_t);
  std::_Rb_tree<$4b2183d$>::clear
            (&(((local_88->
                super___shared_ptr<indigox::algorithm::TDVertScore,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->score)._M_t);
  if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TDVertScore::JoinPropagate(std::shared_ptr<TDVertScore> a, std::shared_ptr<TDVertScore> b)
{
  fMask = a->fMask | b->fMask;
  VertMask notFMask = VertMask(fMask);
  notFMask.flip();
  for (uint32_t e = min_e; e <= max_e; ++e) {
    BagScores tmpBags;
    score.emplace(e, tmpBags);
  }
  
  for (auto& ae : a->score) {
    for (auto& be : b->score) {
      uint32_t e = ae.first + be.first;
      if (e < min_e || e > max_e) continue;
      for (auto& a_bagmask : ae.second) {
        if (score.at(e).find(a_bagmask.first) == score.at(e).end()) {
          MaskScores tmpScores;
          score.at(e).emplace(a_bagmask.first, tmpScores);
        }
        if (be.second.find(a_bagmask.first) == be.second.end()) continue;
//        std::cerr << "Join jobs @" << min_e << "-" << e << "-" << max_e << ": " << be.second.at(a_bagmask.first).size() * a_bagmask.second.size() << std::endl;
        for (auto& a_maskScore : a_bagmask.second) {
          for (auto& b_maskScore : be.second.at(a_bagmask.first)) {
            Score s = a_maskScore.first + b_maskScore.first;
            if (s > parent->upperLimit_) continue;
            ForgetMask placeMask = a_maskScore.second | b_maskScore.second;
            if (opt_::MAXIMUM_RESULT_COUNT == 0
                || score.at(e).at(a_bagmask.first).count(s) < opt_::MAXIMUM_RESULT_COUNT) {
              score.at(e).at(a_bagmask.first).emplace(s, placeMask);
            }
          }
        }
      }
    }
  }
  if (opt_::FPT::MINIMUM_PROPAGATION_DEPTH > 0) {
    for (auto& e : score) {
      for (auto& bm : e.second) {
        std::set<Score> minScores;
        for (auto& ms : bm.second) {
          if (minScores.size() < opt_::FPT::MINIMUM_PROPAGATION_DEPTH) {
            minScores.emplace(ms.first);
          } else {
            Score maxScore = *std::max_element(minScores.begin(), minScores.end());
            if (ms.first < maxScore) minScores.emplace(ms.first);
            if (minScores.size() > opt_::FPT::MINIMUM_PROPAGATION_DEPTH)
              minScores.erase(maxScore);
          }
        }
        Score maxScore = *std::max_element(minScores.begin(), minScores.end());
        for (auto it = bm.second.begin(); it != bm.second.end();) {
          if (it->first > maxScore) it = bm.second.erase(it);
          else ++it;
        }
      }
    }
  }
  
//  if (opt_::MAXIMUM_RESULT_COUNT > 0) {
//    uint32_t x = opt_::MAXIMUM_RESULT_COUNT;
//    for (auto& e : score) {
//      for (auto& bm : e.second) {
//        std::multiset<Score> seenScores;
//        for (auto it = bm.second.begin(); it != bm.second.end();) {
//          seenScores.emplace(it->second);
//          if (seenScores.count(it->second) > x) {
//            it = bm.second.erase(it);
//          } else {
//            ++it;
//          }
//        }
//      }
//    }
//  }
  
  a->score.clear();
  b->score.clear();
}